

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O2

void __thiscall Fl_Window::icons(Fl_Window *this,Fl_RGB_Image **icons,int count)

{
  icon_data *piVar1;
  int iVar2;
  void *pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_EDX;
  undefined4 uVar4;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var_00;
  undefined4 uVar5;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *dst;
  int i;
  ulong uVar6;
  
  dst = (EVP_PKEY_CTX *)icons;
  free_icons(this);
  if (0 < count) {
    pvVar3 = operator_new__((ulong)(uint)count * 8);
    piVar1 = this->icon_;
    *(void **)(piVar1 + 8) = pvVar3;
    *(int *)(piVar1 + 0x10) = count;
    uVar4 = extraout_EDX;
    uVar5 = extraout_var_00;
    for (uVar6 = 0; (uint)count != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = Fl_RGB_Image::copy(icons[uVar6],dst,(EVP_PKEY_CTX *)CONCAT44(uVar5,uVar4));
      *(ulong *)(*(long *)(this->icon_ + 8) + uVar6 * 8) = CONCAT44(extraout_var,iVar2);
      uVar4 = extraout_EDX_00;
      uVar5 = extraout_var_01;
    }
  }
  if (this->i != (Fl_X *)0x0) {
    Fl_X::set_icons(this->i);
    return;
  }
  return;
}

Assistant:

void Fl_Window::icons(const Fl_RGB_Image *icons[], int count) {
  free_icons();

  if (count > 0) {
    icon_->icons = new Fl_RGB_Image*[count];
    icon_->count = count;
    // FIXME: Fl_RGB_Image lacks const modifiers on methods
    for (int i = 0;i < count;i++)
      icon_->icons[i] = (Fl_RGB_Image*)((Fl_RGB_Image*)icons[i])->copy();
  }

  if (i)
    i->set_icons();
}